

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_db_class.cpp
# Opt level: O2

void __thiscall test_cpp_db::test_conversions_ui16::test_method(test_conversions_ui16 *this)

{
  double dVar1;
  readonly_property<bool> rVar2;
  short sVar3;
  int iVar4;
  value *val_00;
  lazy_ostream *plVar5;
  shared_count *psVar6;
  longdouble in_ST0;
  float fVar7;
  uint8_t vui8;
  int8_t vi8;
  lazy_ostream local_2b8;
  undefined1 *local_2a8;
  char **local_2a0;
  value val;
  uint16_t vui16;
  int16_t vi16;
  assertion_result local_280;
  uint32_t vui32;
  int32_t vi32;
  char *local_260;
  char *local_258;
  uint64_t vui64;
  int64_t vi64;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  const_string local_1c0;
  const_string local_1b0;
  value local_1a0;
  const_string local_190;
  const_string local_180;
  const_string local_170;
  const_string local_160;
  const_string local_150;
  const_string local_140;
  const_string local_130;
  const_string local_120;
  const_string local_110;
  const_string local_100;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  val._M_manager = std::any::_Manager_internal<unsigned_short>::_S_manage;
  val._M_storage._M_ptr = (void *)0xd903;
  vi8 = '\x03';
  vui8 = '\x03';
  vi16 = -0x26fd;
  vui16 = 0xd903;
  vi32 = 0xd903;
  vui32 = 0xd903;
  vi64 = 0xd903;
  vui64 = 0xd903;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0xb3,&local_50);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e718;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char **)0x15d094;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_1c8 = "";
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)cpp_db::numeric_extractor<signed_char>(&val);
  plVar5 = &local_2b8;
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,signed_char>
            (plVar5,&local_1d0,0xb3,1,2,&local_280,"cpp_db::value_of<int8_t>(val)",&vi8,"vi8");
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_60.m_end = "";
  local_70.m_begin = "";
  local_70.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar5,&local_60,0xb4,&local_70);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e718;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char **)0x15d094;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_1d8 = "";
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)cpp_db::numeric_extractor<unsigned_char>(&val);
  plVar5 = &local_2b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_char>
            (plVar5,&local_1e0,0xb4,1,2,&local_280,"cpp_db::value_of<uint8_t>(val)",&vui8,"vui8");
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_80.m_end = "";
  local_90.m_begin = "";
  local_90.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar5,&local_80,0xb5,&local_90);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e718;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char **)0x15d094;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_1e8 = "";
  sVar3 = cpp_db::numeric_extractor<short>(&val);
  plVar5 = &local_2b8;
  local_280._0_2_ = sVar3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,short>
            (plVar5,&local_1f0,0xb5,1,2,&local_280,"cpp_db::value_of<int16_t>(val)",&vi16,"vi16");
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar5,&local_a0,0xb6,&local_b0);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e718;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char **)0x15d094;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_1f8 = "";
  local_280._0_2_ = cpp_db::numeric_extractor<unsigned_short>(&val);
  plVar5 = &local_2b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
            (plVar5,&local_200,0xb6,1,2,&local_280,"cpp_db::value_of<uint16_t>(val)",&vui16,"vui16")
  ;
  local_c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_c0.m_end = "";
  local_d0.m_begin = "";
  local_d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar5,&local_c0,0xb7,&local_d0);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e718;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char **)0x15d094;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_208 = "";
  iVar4 = cpp_db::numeric_extractor<int>(&val);
  plVar5 = &local_2b8;
  local_280._0_4_ = iVar4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar5,&local_210,0xb7,1,2,&local_280,"cpp_db::value_of<int32_t>(val)",&vi32,"vi32");
  local_e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_e0.m_end = "";
  local_f0.m_begin = "";
  local_f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar5,&local_e0,0xb8,&local_f0);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e718;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char **)0x15d094;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_218 = "";
  local_280._0_4_ = cpp_db::numeric_extractor<unsigned_int>(&val);
  plVar5 = &local_2b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (plVar5,&local_220,0xb8,1,2,&local_280,"cpp_db::value_of<uint32_t>(val)",&vui32,"vui32")
  ;
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar5,&local_100,0xb9,&local_110);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e718;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char **)0x15d094;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_228 = "";
  local_280._0_8_ = cpp_db::numeric_extractor<long>(&val);
  plVar5 = &local_2b8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (plVar5,&local_230,0xb9,1,2,&local_280,"cpp_db::value_of<int64_t>(val)",&vi64,"vi64");
  local_120.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_120.m_end = "";
  local_130.m_begin = "";
  local_130.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar5,&local_120,0xba,&local_130);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e718;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char **)0x15d094;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_238 = "";
  local_280._0_8_ = cpp_db::numeric_extractor<unsigned_long>(&val);
  plVar5 = &local_2b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar5,&local_240,0xba,1,2,&local_280,"cpp_db::value_of<uint64_t>(val)",&vui64,"vui64")
  ;
  local_140.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_140.m_end = "";
  local_150.m_begin = "";
  local_150.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar5,&local_140,0xbb,&local_150);
  fVar7 = cpp_db::numeric_extractor<float>(&val);
  local_280.m_message.px = (element_type *)0x0;
  local_280.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260 = "std::fabs(cpp_db::value_of<float>(val) - vf) < 1e-6";
  local_258 = "";
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e658;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_160.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_160.m_end = "";
  local_2a0 = &local_260;
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(ABS(fVar7 + -55555.0) < 1e-06);
  boost::test_tools::tt_detail::report_assertion
            (&local_280,&local_2b8,&local_160,0xbb,CHECK,CHECK_PRED,0);
  psVar6 = &local_280.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar6);
  local_170.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_170.m_end = "";
  local_180.m_begin = "";
  local_180.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar6,&local_170,0xbc,&local_180);
  dVar1 = cpp_db::numeric_extractor<double>(&val);
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ABS(dVar1 + -55555.0) < 1e-06);
  local_280.m_message.px = (element_type *)0x0;
  local_280.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260 = "std::fabs(cpp_db::value_of<double>(val) - vd) < 1e-6";
  local_258 = "";
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e658;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_190.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_190.m_end = "";
  local_2a0 = &local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_280,&local_2b8,&local_190,0xbc,CHECK,CHECK_PRED,0);
  psVar6 = &local_280.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar6);
  val_00 = &local_1a0;
  local_1a0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x15da60;
  local_1a0._M_storage._M_ptr = "";
  local_1b0.m_begin = "";
  local_1b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar6,(const_string *)val_00,0xbd,&local_1b0);
  cpp_db::numeric_extractor<long_double>((longdouble *)&val,val_00);
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(ABS(in_ST0 + (longdouble)-55555.0) < (longdouble)1e-06);
  local_280.m_message.px = (element_type *)0x0;
  local_280.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260 = "std::fabs(cpp_db::value_of<long double>(val) - vld) < 1e-6";
  local_258 = "";
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0018e658;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_1c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_1c0.m_end = "";
  local_2a0 = &local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_280,&local_2b8,&local_1c0,0xbd,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_280.m_message.pn);
  std::any::reset(&val);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_conversions_i32)
{
    cpp_db::value val{int32_t{1111111111}};
    int8_t vi8{-57};
    uint8_t vui8{199};
    int16_t vi16{13767};
    uint16_t vui16{13767};
    int32_t vi32{1111111111};
    uint32_t vui32{1111111111};
    int64_t vi64{1111111111};
    uint64_t vui64{1111111111};
    float vf{1111111111.0f};
    double vd{1111111111.0};
    long double vld{1111111111.0l};

    BOOST_CHECK_EQUAL(cpp_db::value_of<int8_t>(val), vi8);
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint8_t>(val), vui8);
    BOOST_CHECK_EQUAL(cpp_db::value_of<int16_t>(val), vi16);
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint16_t>(val), vui16);
    BOOST_CHECK_EQUAL(cpp_db::value_of<int32_t>(val), vi32);
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint32_t>(val), vui32);
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(val), vi64);
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint64_t>(val), vui64);
    BOOST_CHECK(std::fabs(cpp_db::value_of<float>(val) - vf) < 1e-6);
    BOOST_CHECK(std::fabs(cpp_db::value_of<double>(val) - vd) < 1e-6);
    BOOST_CHECK(std::fabs(cpp_db::value_of<long double>(val) - vld) < 1e-6);
}